

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::PricingSession::Unsubscribe(PricingSession *this,Subject *subject)

{
  logger *this_00;
  string local_40;
  
  this_00 = Log;
  price::subject::Subject::ToString_abi_cxx11_(&local_40,subject);
  spdlog::logger::info<std::__cxx11::string>(this_00,"unsubscribing from {}",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
  ::erase(&(this->subscriptions_)._M_t,subject);
  (*(this->pixie_provider_->super_Subscriber)._vptr_Subscriber[2])(this->pixie_provider_,subject);
  return;
}

Assistant:

void PricingSession::Unsubscribe(Subject& subject)
{
    Log->info("unsubscribing from {}", subject.ToString());
    subscriptions_.erase(subject);
    pixie_provider_->Unsubscribe(subject);
}